

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O0

void __thiscall ThreadPool::~ThreadPool(ThreadPool *this)

{
  long in_RDI;
  vector<std::thread,_std::allocator<std::thread>_> *unaff_retaddr;
  ThreadPool *in_stack_00000030;
  
  stop(in_stack_00000030);
  std::__cxx11::list<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>::~list
            ((list<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_> *)0x17f43b);
  std::condition_variable::~condition_variable((condition_variable *)(in_RDI + 0xa8));
  std::condition_variable::~condition_variable((condition_variable *)(in_RDI + 0x48));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)unaff_retaddr);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)unaff_retaddr);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

ThreadPool::~ThreadPool()
{
    stop();
}